

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii.c
# Opt level: O1

int verify_eol_type(coda_ascii_product *product_file,eol_type end_of_line)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (product_file->end_of_line == eol_unknown) {
    product_file->end_of_line = end_of_line;
    iVar1 = 0;
  }
  else {
    iVar1 = 0;
    if (product_file->end_of_line != end_of_line) {
      pcVar2 = eol_type_to_string(end_of_line);
      pcVar3 = eol_type_to_string(product_file->end_of_line);
      coda_set_error(-300,
                     "product error detected (inconsistent end-of-line sequence - got %s but expected %s)"
                     ,pcVar2,pcVar3);
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

static int verify_eol_type(coda_ascii_product *product_file, eol_type end_of_line)
{
    assert(end_of_line != eol_unknown);

    if (product_file->end_of_line == eol_unknown)
    {
        product_file->end_of_line = end_of_line;
        return 0;
    }

    if (product_file->end_of_line != end_of_line)
    {
        coda_set_error(CODA_ERROR_PRODUCT,
                       "product error detected (inconsistent end-of-line sequence - got %s but expected %s)",
                       eol_type_to_string(end_of_line), eol_type_to_string(product_file->end_of_line));
        return -1;
    }

    return 0;
}